

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O1

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>::
QueryPoolGraphicStatisticsTest
          (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::VertexShaderTestInstance>
           *this,TestContext *context,char *name,char *description,
          ParametersGraphic parametersGraphic)

{
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  *this_00;
  allocator<char> local_161;
  long *local_160 [2];
  long local_150 [2];
  value_type local_140;
  RGBA local_120 [2];
  float afStack_118 [2];
  RGBA local_110 [2];
  float afStack_108 [2];
  RGBA local_100 [2];
  float afStack_f8 [2];
  RGBA local_f0 [2];
  float afStack_e8 [2];
  RGBA local_e0 [2];
  float afStack_d8 [2];
  RGBA local_d0 [2];
  float afStack_c8 [2];
  RGBA local_c0 [2];
  float afStack_b8 [2];
  RGBA local_b0 [2];
  float afStack_a8 [2];
  RGBA local_a0 [2];
  float afStack_98 [2];
  RGBA local_90 [2];
  float afStack_88 [2];
  RGBA local_80 [2];
  float afStack_78 [2];
  RGBA local_70 [2];
  float afStack_68 [2];
  RGBA local_60 [2];
  float afStack_58 [2];
  RGBA local_50 [2];
  float afStack_48 [2];
  RGBA local_40 [2];
  float afStack_38 [2];
  RGBA local_30 [2];
  float afStack_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,name,&local_161);
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"");
  tcu::TestCase::TestCase
            ((TestCase *)this,context,(char *)local_140.position.m_data._0_8_,(char *)local_160[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d1aed0;
  if (local_160[0] != local_150) {
    operator_delete(local_160[0],local_150[0] + 1);
  }
  if ((Vec4 *)local_140.position.m_data._0_8_ != &local_140.color) {
    operator_delete((void *)local_140.position.m_data._0_8_,local_140.color.m_data._0_8_ + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__QueryPoolGraphicStatisticsTest_00d2a810;
  this_00 = &this->m_data;
  (this->m_data).
  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_parametersGraphic = (ParametersGraphic)description;
  local_160[0]._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec(local_30);
  local_140.position.m_data[0] = -1.0;
  local_140.position.m_data[1] = -1.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_30[0].m_value;
  local_140.color.m_data[1] = (float)local_30[1].m_value;
  local_140.color.m_data[2] = afStack_28[0];
  local_140.color.m_data[3] = afStack_28[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec(local_40);
  local_140.position.m_data[0] = -1.0;
  local_140.position.m_data[1] = 0.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_40[0].m_value;
  local_140.color.m_data[1] = (float)local_40[1].m_value;
  local_140.color.m_data[2] = afStack_38[0];
  local_140.color.m_data[3] = afStack_38[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec(local_50);
  local_140.position.m_data[0] = 0.0;
  local_140.position.m_data[1] = -1.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_50[0].m_value;
  local_140.color.m_data[1] = (float)local_50[1].m_value;
  local_140.color.m_data[2] = afStack_48[0];
  local_140.color.m_data[3] = afStack_48[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xff0000ff;
  tcu::RGBA::toVec(local_60);
  local_140.position.m_data[0] = 0.0;
  local_140.position.m_data[1] = 0.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_60[0].m_value;
  local_140.color.m_data[1] = (float)local_60[1].m_value;
  local_140.color.m_data[2] = afStack_58[0];
  local_140.color.m_data[3] = afStack_58[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec(local_70);
  local_140.position.m_data[0] = -1.0;
  local_140.position.m_data[1] = 0.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_70[0].m_value;
  local_140.color.m_data[1] = (float)local_70[1].m_value;
  local_140.color.m_data[2] = afStack_68[0];
  local_140.color.m_data[3] = afStack_68[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec(local_80);
  local_140.position.m_data[0] = -1.0;
  local_140.position.m_data[1] = 1.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_80[0].m_value;
  local_140.color.m_data[1] = (float)local_80[1].m_value;
  local_140.color.m_data[2] = afStack_78[0];
  local_140.color.m_data[3] = afStack_78[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec(local_90);
  local_140.position.m_data[0] = 0.0;
  local_140.position.m_data[1] = 0.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_90[0].m_value;
  local_140.color.m_data[1] = (float)local_90[1].m_value;
  local_140.color.m_data[2] = afStack_88[0];
  local_140.color.m_data[3] = afStack_88[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec(local_a0);
  local_140.position.m_data[0] = 0.0;
  local_140.position.m_data[1] = 1.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_a0[0].m_value;
  local_140.color.m_data[1] = (float)local_a0[1].m_value;
  local_140.color.m_data[2] = afStack_98[0];
  local_140.color.m_data[3] = afStack_98[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xffff0000;
  tcu::RGBA::toVec(local_b0);
  local_140.position.m_data[0] = 0.0;
  local_140.position.m_data[1] = -1.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_b0[0].m_value;
  local_140.color.m_data[1] = (float)local_b0[1].m_value;
  local_140.color.m_data[2] = afStack_a8[0];
  local_140.color.m_data[3] = afStack_a8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xffff0000;
  tcu::RGBA::toVec(local_c0);
  local_140.position.m_data[0] = 0.0;
  local_140.position.m_data[1] = 0.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_c0[0].m_value;
  local_140.color.m_data[1] = (float)local_c0[1].m_value;
  local_140.color.m_data[2] = afStack_b8[0];
  local_140.color.m_data[3] = afStack_b8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xffff0000;
  tcu::RGBA::toVec(local_d0);
  local_140.position.m_data[0] = 1.0;
  local_140.position.m_data[1] = -1.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_d0[0].m_value;
  local_140.color.m_data[1] = (float)local_d0[1].m_value;
  local_140.color.m_data[2] = afStack_c8[0];
  local_140.color.m_data[3] = afStack_c8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xffff0000;
  tcu::RGBA::toVec(local_e0);
  local_140.position.m_data[0] = 1.0;
  local_140.position.m_data[1] = 0.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_e0[0].m_value;
  local_140.color.m_data[1] = (float)local_e0[1].m_value;
  local_140.color.m_data[2] = afStack_d8[0];
  local_140.color.m_data[3] = afStack_d8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xff808080;
  tcu::RGBA::toVec(local_f0);
  local_140.position.m_data[0] = 0.0;
  local_140.position.m_data[1] = 0.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_f0[0].m_value;
  local_140.color.m_data[1] = (float)local_f0[1].m_value;
  local_140.color.m_data[2] = afStack_e8[0];
  local_140.color.m_data[3] = afStack_e8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xff808080;
  tcu::RGBA::toVec(local_100);
  local_140.position.m_data[0] = 0.0;
  local_140.position.m_data[1] = 1.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_100[0].m_value;
  local_140.color.m_data[1] = (float)local_100[1].m_value;
  local_140.color.m_data[2] = afStack_f8[0];
  local_140.color.m_data[3] = afStack_f8[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0]._0_4_ = 0xff808080;
  tcu::RGBA::toVec(local_110);
  local_140.position.m_data[0] = 1.0;
  local_140.position.m_data[1] = 0.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_110[0].m_value;
  local_140.color.m_data[1] = (float)local_110[1].m_value;
  local_140.color.m_data[2] = afStack_108[0];
  local_140.color.m_data[3] = afStack_108[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  local_160[0] = (long *)CONCAT44(local_160[0]._4_4_,0xff808080);
  tcu::RGBA::toVec(local_120);
  local_140.position.m_data[0] = 1.0;
  local_140.position.m_data[1] = 1.0;
  local_140.position.m_data[2] = 1.0;
  local_140.position.m_data[3] = 1.0;
  local_140.color.m_data[0] = (float)local_120[0].m_value;
  local_140.color.m_data[1] = (float)local_120[1].m_value;
  local_140.color.m_data[2] = afStack_118[0];
  local_140.color.m_data[3] = afStack_118[1];
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(this_00,&local_140);
  return;
}

Assistant:

QueryPoolGraphicStatisticsTest (tcu::TestContext &context, const char *name, const char *description, const GraphicBasicTestInstance::ParametersGraphic parametersGraphic)
		: TestCase				(context, name, description)
		, m_parametersGraphic	(parametersGraphic)
	{
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
	}